

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O0

void __thiscall
cfdcapi_coin_EstimateFeeBySchnorr_Test::TestBody(cfdcapi_coin_EstimateFeeBySchnorr_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  char *pcVar2;
  reference pUVar3;
  Script *expected_predicate_value;
  Amount AVar4;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int64_t utxo_fee;
  int64_t tx_fee;
  AssertionResult gtest_ar_2;
  UtxoData *utxo;
  iterator __end2;
  iterator __begin2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2;
  AssertionResult gtest_ar_1;
  void *fee_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  AddressFactory factory;
  Script *this_00;
  string *in_stack_fffffffffffff0f0;
  UtxoData *this_01;
  AddressFactory *in_stack_fffffffffffff0f8;
  string *lhs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff10c;
  ConfidentialAssetId *__a;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_03;
  iterator handle_00;
  BlindFactor *pBVar6;
  Script *in_stack_fffffffffffff158;
  undefined4 in_stack_fffffffffffff160;
  uint32_t in_stack_fffffffffffff164;
  Txid *in_stack_fffffffffffff168;
  undefined7 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  undefined4 in_stack_fffffffffffff178;
  undefined4 in_stack_fffffffffffff17c;
  UtxoData *in_stack_fffffffffffff180;
  undefined4 in_stack_fffffffffffff188;
  int in_stack_fffffffffffff18c;
  Script *in_stack_fffffffffffff190;
  undefined7 in_stack_fffffffffffff198;
  undefined1 in_stack_fffffffffffff19f;
  string *in_stack_fffffffffffff1a0;
  undefined7 in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1af;
  AddressType in_stack_fffffffffffff1b0;
  undefined4 in_stack_fffffffffffff1b8;
  undefined4 in_stack_fffffffffffff1bc;
  undefined1 is_elements;
  ConfidentialAssetId *in_stack_fffffffffffff1c0;
  undefined7 in_stack_fffffffffffff1c8;
  undefined1 in_stack_fffffffffffff1cf;
  BlindFactor *in_stack_fffffffffffff1d0;
  undefined4 in_stack_fffffffffffff1d8;
  undefined4 in_stack_fffffffffffff1dc;
  ConfidentialValue *in_stack_fffffffffffff1e0;
  Script *in_stack_fffffffffffff1e8;
  undefined1 ***local_db0;
  AssertHelper local_d58;
  Message local_d50;
  undefined4 local_d44;
  AssertionResult local_d40;
  AssertHelper local_d30;
  Message local_d28;
  AssertionResult local_d20;
  AssertHelper local_d10;
  Message local_d08;
  undefined4 local_cfc;
  AssertionResult local_cf8;
  char *local_ce8;
  AssertHelper local_ce0;
  Message local_cd8;
  undefined4 local_ccc;
  AssertionResult local_cc8;
  AssertHelper local_cb8;
  Message local_cb0;
  undefined8 local_ca8;
  AssertionResult local_ca0;
  AssertHelper local_c90;
  Message local_c88;
  undefined8 local_c80;
  AssertionResult local_c78;
  AssertHelper local_c68;
  Message local_c60;
  undefined4 local_c54;
  AssertionResult local_c50;
  double in_stack_fffffffffffff3c0;
  undefined1 in_stack_fffffffffffff3cf;
  AssertHelper in_stack_fffffffffffff3d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff3d8;
  undefined4 in_stack_fffffffffffff3e0;
  undefined4 in_stack_fffffffffffff3e4;
  char *in_stack_fffffffffffff3e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff3f0;
  void *in_stack_fffffffffffff3f8;
  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_bd8;
  undefined1 *local_bd0;
  AssertHelper local_bc8;
  Message local_bc0;
  undefined4 local_bb4;
  AssertionResult local_bb0;
  undefined8 local_ba0;
  string local_b98;
  AssertHelper local_b78;
  Message local_b70;
  undefined1 local_b61;
  AssertionResult local_b60;
  AssertHelper local_b50;
  Message local_b48;
  undefined4 local_b3c;
  AssertionResult local_b38;
  int local_b24;
  long local_b20;
  undefined1 local_b11;
  Script local_b10;
  ConfidentialValue local_ad8;
  BlindFactor local_ab0;
  undefined1 local_a90 [464];
  ConfidentialAssetId local_8c0;
  pointer local_898;
  uint8_t local_890;
  undefined1 local_888 [24];
  string local_870 [39];
  allocator local_849;
  string local_848 [32];
  undefined1 local_828 [384];
  string local_6a8;
  Script local_688;
  allocator local_649;
  string local_648;
  Script local_628;
  allocator local_5e9;
  string local_5e8;
  Txid local_5c8;
  allocator local_591;
  string local_590;
  BlockHash local_570;
  uchar **local_550;
  undefined1 **local_548 [120];
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  void *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffee0;
  uint32_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  uchar **local_58;
  undefined8 local_50;
  undefined1 local_48 [72];
  
  cfd::AddressFactory::AddressFactory((AddressFactory *)0x3085fc);
  local_b11 = 1;
  local_550 = (uchar **)local_548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_590,"590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"
             ,&local_591);
  cfd::core::BlockHash::BlockHash(&local_570,&local_590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5e8,"2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916"
             ,&local_5e9);
  cfd::core::Txid::Txid(&local_5c8,&local_5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_648,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",&local_649);
  cfd::core::Script::Script(&local_628,&local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"",(allocator *)(local_828 + 0x17f));
  cfd::core::Script::Script(&local_688,&local_6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_848,"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",&local_849);
  cfd::AddressFactory::GetAddress(in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_870,"raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
             (allocator *)(local_888 + 0x17));
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x9502f518);
  local_898 = (pointer)AVar4.amount_;
  local_890 = AVar4.ignore_check_;
  local_888._0_8_ = local_898;
  local_888[8] = local_890;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_8c0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(local_a90 + 0x20));
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_a90);
  cfd::core::BlindFactor::BlindFactor(&local_ab0);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_ad8);
  cfd::core::Script::Script(&local_b10);
  pBVar6 = &local_ab0;
  handle_00 = (iterator)local_a90;
  this_03 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)(local_a90 + 0x20);
  __a = &local_8c0;
  this_02 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)local_888;
  lhs = local_870;
  this_01 = (UtxoData *)local_828;
  this_00 = &local_688;
  uVar5 = 7;
  expected_predicate_value = &local_628;
  cfd::UtxoData::UtxoData
            (in_stack_fffffffffffff180,CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178)
             ,(BlockHash *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             in_stack_fffffffffffff168,in_stack_fffffffffffff164,in_stack_fffffffffffff158,
             in_stack_fffffffffffff190,
             (Address *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
             in_stack_fffffffffffff1a0,
             (Amount *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8),
             in_stack_fffffffffffff1b0,
             (void *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
             in_stack_fffffffffffff1c0,
             (ElementsConfidentialAddress *)
             CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),in_stack_fffffffffffff1d0
             ,(BlindFactor *)CONCAT44(in_stack_fffffffffffff1dc,in_stack_fffffffffffff1d8),
             in_stack_fffffffffffff1e0,in_stack_fffffffffffff1e8);
  local_b11 = 0;
  local_58 = (uchar **)local_548;
  local_50 = 1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x30896b);
  __l._M_len = (size_type)pBVar6;
  __l._M_array = handle_00;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (this_03,__l,(allocator_type *)__a);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x30899f);
  local_db0 = &local_58;
  do {
    local_db0 = local_db0 + -0x9e;
    cfd::UtxoData::~UtxoData(this_01);
    is_elements = (undefined1)((uint)in_stack_fffffffffffff1bc >> 0x18);
  } while (local_db0 != local_548);
  cfd::core::Script::~Script((Script *)this_01);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x308a10);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x308a1d);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x308a2a);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x308a44);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)(local_888 + 0x17));
  cfd::core::Address::~Address((Address *)this_01);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  cfd::core::Script::~Script((Script *)this_01);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_828 + 0x17f));
  cfd::core::Script::~Script((Script *)this_01);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  cfd::core::Txid::~Txid((Txid *)0x308ae0);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x308b07);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  local_b20 = 0;
  local_b24 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffff10c,uVar5));
  local_b3c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(CfdErrorCode *)lhs,
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b38);
  if (!bVar1) {
    testing::Message::Message(&local_b48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x308fcf);
    testing::internal::AssertHelper::AssertHelper
              (&local_b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b50,&local_b48);
    testing::internal::AssertHelper::~AssertHelper(&local_b50);
    testing::Message::~Message((Message *)0x309032);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x309087);
  local_b61 = local_b20 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)this_00,(type *)0x3090b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b60);
  if (!bVar1) {
    testing::Message::Message(&local_b70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b98,(internal *)&local_b60,(AssertionResult *)"(NULL == handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b78,&local_b70);
    testing::internal::AssertHelper::~AssertHelper(&local_b78);
    std::__cxx11::string::~string((string *)&local_b98);
    testing::Message::~Message((Message *)0x3091b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30922c);
  local_ba0 = 0;
  local_b24 = CfdInitializeEstimateFee
                        ((void *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
                         &in_stack_fffffffffffff1c0->_vptr_ConfidentialAssetId,(bool)is_elements);
  local_bb4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(CfdErrorCode *)lhs,
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bb0);
  if (!bVar1) {
    testing::Message::Message(&local_bc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30930d);
    testing::internal::AssertHelper::AssertHelper
              (&local_bc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bc8,&local_bc0);
    testing::internal::AssertHelper::~AssertHelper(&local_bc8);
    testing::Message::~Message((Message *)0x309370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3093c8);
  if (local_b24 == 0) {
    local_bd0 = local_48;
    local_bd8._M_current =
         (UtxoData *)
         std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                   ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00);
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)this_01,
                              (__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)this_00), bVar1) {
      pUVar3 = __gnu_cxx::
               __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
               ::operator*(&local_bd8);
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&stack0xfffffffffffff3f8,&pUVar3->txid);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      uVar5 = 0;
      this_02 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
      lhs = (string *)((ulong)lhs & 0xffffffff00000000);
      this_01 = (UtxoData *)((ulong)this_01 & 0xffffffff00000000);
      this_00 = (Script *)((ulong)this_00 & 0xffffffff00000000);
      local_b24 = CfdAddTxInputForEstimateFee
                            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                             in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                             (bool)in_stack_fffffffffffffe7f,(bool)in_stack_fffffffffffffe7e,
                             (bool)in_stack_fffffffffffffe7d,in_stack_fffffffffffffed8,
                             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffef0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff3f8);
      in_stack_fffffffffffff3e4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,
                 (CfdErrorCode *)lhs,(int *)this_01);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff3e8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffff3d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x309603);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff3d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0xd0,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff3d0,(Message *)&stack0xfffffffffffff3d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff3d0);
        testing::Message::~Message((Message *)0x309666);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3096bb);
      __gnu_cxx::
      __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
      ::operator++(&local_bd8);
    }
    local_b24 = CfdFinalizeEstimateFee
                          (in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0.ptr_,
                           in_stack_fffffffffffff3e8,
                           (char *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                           (int64_t *)in_stack_fffffffffffff3d8.ptr_,
                           (int64_t *)in_stack_fffffffffffff3d0.data_,
                           (bool)in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c0);
    local_c54 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(CfdErrorCode *)lhs
               ,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c50);
    if (!bVar1) {
      testing::Message::Message(&local_c60);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3097cc);
      testing::internal::AssertHelper::AssertHelper
                (&local_c68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xd6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c68,&local_c60);
      testing::internal::AssertHelper::~AssertHelper(&local_c68);
      testing::Message::~Message((Message *)0x30982f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x309884);
    local_c80 = 0x56;
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(long *)lhs,
               (long *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c78);
    if (!bVar1) {
      testing::Message::Message(&local_c88);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30992c);
      testing::internal::AssertHelper::AssertHelper
                (&local_c90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xd7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
      testing::internal::AssertHelper::~AssertHelper(&local_c90);
      testing::Message::~Message((Message *)0x30998f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3099e4);
    local_ca8 = 0x74;
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(long *)lhs,
               (long *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ca0);
    if (!bVar1) {
      testing::Message::Message(&local_cb0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x309a8c);
      testing::internal::AssertHelper::AssertHelper
                (&local_cb8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xd8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_cb8,&local_cb0);
      testing::internal::AssertHelper::~AssertHelper(&local_cb8);
      testing::Message::~Message((Message *)0x309aef);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x309b47);
    in_stack_fffffffffffff18c =
         CfdFreeEstimateFeeHandle
                   (in_stack_fffffffffffff168,
                    (void *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160));
    local_ccc = 0;
    local_b24 = in_stack_fffffffffffff18c;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(CfdErrorCode *)lhs
               ,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cc8);
    in_stack_fffffffffffff188 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff188);
    if (!bVar1) {
      testing::Message::Message(&local_cd8);
      in_stack_fffffffffffff180 =
           (UtxoData *)testing::AssertionResult::failure_message((AssertionResult *)0x309c1a);
      testing::internal::AssertHelper::AssertHelper
                (&local_ce0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xdb,(char *)in_stack_fffffffffffff180);
      testing::internal::AssertHelper::operator=(&local_ce0,&local_cd8);
      testing::internal::AssertHelper::~AssertHelper(&local_ce0);
      testing::Message::~Message((Message *)0x309c7d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x309cd2);
  }
  local_b24 = CfdGetLastErrorCode(handle_00);
  if (local_b24 != 0) {
    local_ce8 = (char *)0x0;
    local_b24 = CfdGetLastErrorMessage
                          ((void *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188),
                           (char **)in_stack_fffffffffffff180);
    local_cfc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(CfdErrorCode *)lhs
               ,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cf8);
    if (!bVar1) {
      testing::Message::Message(&local_d08);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x309de5);
      testing::internal::AssertHelper::AssertHelper
                (&local_d10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xe5,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d10,&local_d08);
      testing::internal::AssertHelper::~AssertHelper(&local_d10);
      testing::Message::~Message((Message *)0x309e48);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x309e9d);
    testing::internal::CmpHelperSTREQ((internal *)&local_d20,"\"\"","str_buffer","",local_ce8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d20);
    if (!bVar1) {
      testing::Message::Message(&local_d28);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x309f32);
      testing::internal::AssertHelper::AssertHelper
                (&local_d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xe6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d30,&local_d28);
      testing::internal::AssertHelper::~AssertHelper(&local_d30);
      testing::Message::~Message((Message *)0x309f8f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x309fe4);
    CfdFreeStringBuffer((char *)lhs);
    local_ce8 = (char *)0x0;
  }
  local_b24 = CfdFreeHandle(lhs);
  local_d44 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff10c,uVar5),(char *)this_02,(CfdErrorCode *)lhs,
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d40);
  if (!bVar1) {
    testing::Message::Message(&local_d50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30a0c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    testing::Message::~Message((Message *)0x30a11d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30a172);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x30a18c);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeBySchnorr) {
  // FIXME 実装する
  AddressFactory factory;
  std::vector<UtxoData> utxos = {
    UtxoData{
      12,
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916"),
      0,
      Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb"),
      Script(""),
      factory.GetAddress("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4"),
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      Amount::CreateBySatoshiAmount(2499999000),
      AddressType::kTaprootAddress,
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    }
  };

  // 1 output data
  static const char* const kTxData = "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInputForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, nullptr, 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 2.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(86), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(116), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  // exp: 0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014161f75636003a870b7a1685abae84eedf8c9527227ac70183c376f7b3a35b07ebcbea14749e58ce1a87565b035b2f3963baa5ae3ede95e89fd607ab7849f208720100000000
  // vsize: 100

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}